

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O3

wstring * __thiscall
mjs::do_format_double_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,double m,int k)

{
  char *__s;
  long *plVar1;
  undefined4 uVar2;
  wostream *pwVar3;
  size_t sVar4;
  wostream *this_00;
  int iVar5;
  int k_;
  wostringstream woss;
  wchar_t *local_208;
  long local_200;
  long local_1f8 [2];
  ecvt_result local_1e4;
  wchar_t *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  long local_1a8 [14];
  ios_base local_138 [128];
  long alStack_b8 [17];
  
  iVar5 = (int)this;
  anon_unknown_1::do_ecvt(&local_1e4,m,iVar5);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
  if (local_1e4.n < 0x16 && iVar5 <= local_1e4.n) {
    pwVar3 = std::operator<<((wostream *)local_1a8,local_1e4.s);
    local_208 = (wchar_t *)local_1f8;
    std::__cxx11::wstring::_M_construct((ulong)&local_208,local_1e4.n - iVar5);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar3,local_208,local_200);
LAB_00150c1c:
    if (local_208 == (wchar_t *)local_1f8) goto LAB_00150d20;
  }
  else {
    if (0x14 < local_1e4.n - 1U) {
      if (5 < local_1e4.n + 5U) {
        if (iVar5 == 1) {
          pwVar3 = std::operator<<((wostream *)local_1a8,local_1e4.s);
          plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
          if (plVar1 == (long *)0x0) {
LAB_00150f62:
            std::__throw_bad_cast();
          }
          uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x65);
          local_208 = (wchar_t *)CONCAT44(local_208._4_4_,uVar2);
          pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                             (pwVar3,(wchar_t *)&local_208,1);
          plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
          if (plVar1 == (long *)0x0) goto LAB_00150f62;
          uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,(local_1e4.n < 1) * '\x02' + '+');
          local_208 = (wchar_t *)CONCAT44(local_208._4_4_,uVar2);
          this_00 = (wostream *)
                    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                              (pwVar3,(wchar_t *)&local_208,1);
        }
        else {
          plVar1 = *(long **)((long)alStack_b8 + *(long *)(local_1a8[0] + -0x18));
          if (plVar1 == (long *)0x0) goto LAB_00150f62;
          uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,(int)local_1e4.s[0]);
          local_208 = (wchar_t *)CONCAT44(local_208._4_4_,uVar2);
          pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                             ((wostream *)local_1a8,(wchar_t *)&local_208,1);
          plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
          if (plVar1 == (long *)0x0) goto LAB_00150f62;
          uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x2e);
          local_208 = (wchar_t *)CONCAT44(local_208._4_4_,uVar2);
          pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                             (pwVar3,(wchar_t *)&local_208,1);
          pwVar3 = std::operator<<(pwVar3,local_1e4.s + 1);
          plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
          if (plVar1 == (long *)0x0) goto LAB_00150f62;
          uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x65);
          local_208 = (wchar_t *)CONCAT44(local_208._4_4_,uVar2);
          pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                             (pwVar3,(wchar_t *)&local_208,1);
          plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
          if (plVar1 == (long *)0x0) goto LAB_00150f62;
          uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,(local_1e4.n < 1) * '\x02' + '+');
          local_208 = (wchar_t *)CONCAT44(local_208._4_4_,uVar2);
          this_00 = (wostream *)
                    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                              (pwVar3,(wchar_t *)&local_208,1);
        }
        local_1e4.n = local_1e4.n - 1;
        iVar5 = -local_1e4.n;
        if (0 < local_1e4.n) {
          iVar5 = local_1e4.n;
        }
        std::wostream::operator<<(this_00,iVar5);
        goto LAB_00150d20;
      }
      pwVar3 = std::operator<<((wostream *)local_1a8,"0.");
      local_208 = (wchar_t *)local_1f8;
      std::__cxx11::wstring::_M_construct((ulong)&local_208,-local_1e4.n);
      pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar3,local_208,local_200);
      std::operator<<(pwVar3,local_1e4.s);
      goto LAB_00150c1c;
    }
    __s = local_1e4.s;
    local_208 = (wchar_t *)local_1f8;
    std::__cxx11::wstring::_M_construct<char*>
              ((wstring *)&local_208,__s,local_1e4.s + (uint)local_1e4.n);
    pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       ((wostream *)local_1a8,local_208,local_200);
    plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
    if (plVar1 == (long *)0x0) {
      std::__throw_bad_cast();
    }
    uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x2e);
    local_1c8 = (wchar_t *)CONCAT44(local_1c8._4_4_,uVar2);
    pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       (pwVar3,(wchar_t *)&local_1c8,1);
    sVar4 = strlen(__s);
    local_1c8 = (wchar_t *)local_1b8;
    std::__cxx11::wstring::_M_construct<char*>((wstring *)&local_1c8,__s + local_1e4.n,__s + sVar4);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar3,local_1c8,local_1c0);
    if (local_1c8 != (wchar_t *)local_1b8) {
      operator_delete(local_1c8,local_1b8[0] * 4 + 4);
    }
    if (local_208 == (wchar_t *)local_1f8) goto LAB_00150d20;
  }
  operator_delete(local_208,local_1f8[0] * 4 + 4);
LAB_00150d20:
  std::__cxx11::wstringbuf::str();
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::wstring do_format_double(double m, int k) {
    auto [k_, n, s] = do_ecvt(m, k); (void)k_;

    std::wostringstream woss;
    if (k <= n && n <= 21) {
        // 6. If k <= n <= 21, return the string consisting of the k digits of the decimal
        // representation of s (in order, with no leading zeroes), followed by n - k
        // occurences of the character �0�
        woss << s << std::wstring(n-k, '0');
    } else if (0 < n && n <= 21) {
        // 7. If 0 < n <= 21, return the string consisting of the most significant n digits
        // of the decimal representation of s, followed by a decimal point �.�, followed
        // by the remaining k - n digits of the decimal representation of s.
        woss << std::wstring(s, s + n) << '.' << std::wstring(s + n, s + std::strlen(s));
    } else if (-6 < n && n <= 0) {
        // 8. If -6 < n <= 0, return the string consisting of the character �0�, followed
        // by a decimal point �.�, followed by -n occurences of the character �0�, followed
        // by the k digits of the decimal representation of s.
        woss << "0." << std::wstring(-n, '0') << s;
    } else if (k == 1) {
        // 9.  Otherwise, if k = 1, return the string consisting of the single digit of s,
        // followed by lowercase character �e�, followed by a plus sign �+� or minus sign
        // �-� according to whether n - 1 is positive or negative, followed by the decimal
        // representation of the integer abs(n - 1) (with no leading zeros).
        woss << s << 'e' << (n-1>=0?'+':'-') << std::abs(n-1);
    } else {
        // 10. Return the string consisting of the most significant digit of the decimal
        // representation of s, followed by a decimal point �.�, followed by the remaining
        // k - 1 digits of the decimal representation of s , followed by the lowercase character
        // �e�, followed by a plus sign �+� or minus sign �-� according to whether n - 1 is positive
        // or negative, followed by the decimal representation of the integer abs(n - 1)
        // (with no leading zeros)
        woss << s[0] << '.' << s+1 << 'e' << (n-1>=0?'+':'-') << std::abs(n-1);
    }
    return woss.str();
}